

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Accumulator.hpp
# Opt level: O0

Vector<double,_3U> * __thiscall
OpenMD::Utils::Accumulator<OpenMD::Vector<double,_3U>_>::get95percentConfidenceInterval
          (Accumulator<OpenMD::Vector<double,_3U>_> *this)

{
  double dVar1;
  undefined8 uVar2;
  double *pdVar3;
  undefined8 *in_RSI;
  Vector<double,_3U> *in_RDI;
  double dVar4;
  undefined1 auVar5 [16];
  size_t i;
  Vector<double,_3U> stdDev;
  Vector<double,_3U> *ci;
  ulong local_30;
  Accumulator<OpenMD::Vector<double,_3U>_> *in_stack_ffffffffffffffe8;
  
  Vector<double,_3U>::Vector(in_RDI);
  getStdDev(in_stack_ffffffffffffffe8);
  for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
    pdVar3 = Vector<double,_3U>::operator[]
                       ((Vector<double,_3U> *)&stack0xffffffffffffffd8,(uint)local_30);
    dVar1 = *pdVar3;
    uVar2 = *in_RSI;
    auVar5._8_4_ = (int)((ulong)uVar2 >> 0x20);
    auVar5._0_8_ = uVar2;
    auVar5._12_4_ = 0x45300000;
    dVar4 = sqrt((auVar5._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
    pdVar3 = Vector<double,_3U>::operator[](in_RDI,(uint)local_30);
    *pdVar3 = (dVar1 * 1.96) / dVar4;
  }
  return in_RDI;
}

Assistant:

Vector<RealType, Dim> get95percentConfidenceInterval() const {
      assert(Count_ != 0);

      Vector<RealType, Dim> ci {};
      Vector<RealType, Dim> stdDev = this->getStdDev();

      for (std::size_t i = 0; i < Dim; i++) {
        ci[i] = 1.960 * stdDev[i] / std::sqrt(static_cast<RealType>(Count_));
      }

      return ci;
    }